

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ez-rpc.c++
# Opt level: O0

Client __thiscall capnp::EzRpcServer::Impl::restore(Impl *this,Reader objectId)

{
  bool bVar1;
  pointer ppVar2;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  ClientHook *extraout_RDX_01;
  ClientHook *pCVar3;
  long in_RSI;
  Client CVar4;
  Fault local_40;
  Fault f;
  _Self local_30;
  iterator iter;
  ReaderFor<capnp::Text> name;
  Impl *this_local;
  
  bVar1 = AnyPointer::Reader::isNull(&objectId);
  if (bVar1) {
    Capability::Client::Client((Client *)this,(Client *)(in_RSI + 0x10));
    pCVar3 = extraout_RDX;
  }
  else {
    _iter = (ArrayPtr<const_char>)AnyPointer::Reader::getAs<capnp::Text>(&objectId);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<kj::StringPtr,_capnp::EzRpcServer::Impl::ExportedCap,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::EzRpcServer::Impl::ExportedCap>_>_>
         ::find((map<kj::StringPtr,_capnp::EzRpcServer::Impl::ExportedCap,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::EzRpcServer::Impl::ExportedCap>_>_>
                 *)(in_RSI + 0x30),(key_type *)&iter);
    f.exception = (Exception *)
                  std::
                  map<kj::StringPtr,_capnp::EzRpcServer::Impl::ExportedCap,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::EzRpcServer::Impl::ExportedCap>_>_>
                  ::end((map<kj::StringPtr,_capnp::EzRpcServer::Impl::ExportedCap,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::EzRpcServer::Impl::ExportedCap>_>_>
                         *)(in_RSI + 0x30));
    bVar1 = std::operator==(&local_30,(_Self *)&f);
    if (bVar1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[35],capnp::Text::Reader&>
                (&local_40,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/ez-rpc.c++"
                 ,0x139,FAILED,(char *)0x0,"\"Server exports no such capability.\", name",
                 (char (*) [35])"Server exports no such capability.",(Reader *)&iter);
      kj::_::Debug::Fault::~Fault(&local_40);
      Capability::Client::Client((Client *)this,(void *)0x0);
      pCVar3 = extraout_RDX_00;
    }
    else {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::EzRpcServer::Impl::ExportedCap>_>
               ::operator->(&local_30);
      Capability::Client::Client((Client *)this,&(ppVar2->second).cap);
      pCVar3 = extraout_RDX_01;
    }
  }
  CVar4.hook.ptr = pCVar3;
  CVar4.hook.disposer = (Disposer *)this;
  return (Client)CVar4.hook;
}

Assistant:

Capability::Client restore(AnyPointer::Reader objectId) override {
    if (objectId.isNull()) {
      return mainInterface;
    } else {
      auto name = objectId.getAs<Text>();
      auto iter = exportMap.find(name);
      if (iter == exportMap.end()) {
        KJ_FAIL_REQUIRE("Server exports no such capability.", name) { break; }
        return nullptr;
      } else {
        return iter->second.cap;
      }
    }
  }